

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::ReadIntoBuffer(BamStandardIndex *this,uint *bytesRequested)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  BamException *this_00;
  allocator local_1e1;
  string local_1e0;
  string local_1c0;
  stringstream s;
  ostream local_190 [376];
  
  CheckBufferSize(&(this->m_resources).Buffer,&this->m_bufferLength,bytesRequested);
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,(this->m_resources).Buffer,(ulong)*bytesRequested)
  ;
  if (CONCAT44(extraout_var,iVar2) == (ulong)*bytesRequested) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar3 = std::operator<<(local_190,"expected to read: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," bytes, ");
  poVar3 = std::operator<<(poVar3,"but instead read: ");
  std::ostream::_M_insert<long>((long)poVar3);
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_1c0,"BamStandardIndex::ReadIntoBuffer",&local_1e1);
  std::__cxx11::stringbuf::str();
  BamException::BamException(this_00,&local_1c0,&local_1e0);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::ReadIntoBuffer(const unsigned int& bytesRequested)
{

    // ensure that our buffer is big enough for request
    BamStandardIndex::CheckBufferSize(m_resources.Buffer, m_bufferLength, bytesRequested);

    // read from BAI file stream
    const int64_t bytesRead = m_resources.Device->Read(m_resources.Buffer, bytesRequested);
    if (bytesRead != static_cast<int64_t>(bytesRequested)) {
        std::stringstream s;
        s << "expected to read: " << bytesRequested << " bytes, "
          << "but instead read: " << bytesRead;
        throw BamException("BamStandardIndex::ReadIntoBuffer", s.str());
    }
}